

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O1

int cmd_feature(char *arg)

{
  ulong uVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  uint8_t *puVar5;
  char *pcVar6;
  long lVar7;
  long *__ptr;
  long *plVar8;
  undefined8 *__ptr_00;
  ulong uVar9;
  uint uVar10;
  size_t sVar11;
  char *local_58;
  undefined4 local_4c;
  void *pvStack_48;
  int option_index;
  uint8_t *states;
  undefined8 *local_38;
  
  puVar3 = (undefined8 *)malloc(0x10);
  pcVar4 = strdup(arg);
  *puVar3 = pcVar4;
  strtok(pcVar4," ");
  states = (uint8_t *)0x0;
  pcVar4 = strtok((char *)0x0," ");
  if (pcVar4 == (char *)0x0) {
    uVar10 = 1;
  }
  else {
    sVar11 = 0x18;
    uVar10 = 1;
    __ptr_00 = puVar3;
    do {
      puVar3 = (undefined8 *)realloc(__ptr_00,sVar11);
      if (puVar3 == (undefined8 *)0x0) {
        cmd_feature_cold_1();
        goto LAB_00109c54;
      }
      *(char **)((long)puVar3 + (sVar11 - 0x10)) = pcVar4;
      pcVar4 = strtok((char *)0x0," ");
      sVar11 = sVar11 + 8;
      uVar10 = uVar10 + 1;
      __ptr_00 = puVar3;
    } while (pcVar4 != (char *)0x0);
  }
  puVar3[uVar10] = 0;
  _optind = 0;
  local_58 = (char *)0x0;
  local_38 = puVar3;
  do {
    while( true ) {
      local_4c = 0;
      iVar2 = getopt_long(uVar10,local_38,"he:d:",cmd_feature::long_options,&local_4c);
      if (iVar2 < 0x65) break;
      if (iVar2 == 0x65) {
        puVar5 = (uint8_t *)0x1;
        if ((int)states != 0) {
          cmd_feature_cold_4();
          __ptr_00 = local_38;
          goto LAB_00109c54;
        }
LAB_001099f5:
        local_58 = _optarg;
        states = puVar5;
      }
      else if (iVar2 == 0x68) {
        puts(
            "feature [ -(-e)nable | -(-d)isable (* | <feature-name>[,<feature-name> ...]) ] <model-name>[@<revision>]"
            );
        iVar2 = 0;
        __ptr_00 = local_38;
        goto LAB_00109c19;
      }
    }
    if (iVar2 == -1) {
      if (_optind == uVar10) {
        cmd_feature_cold_5();
        __ptr_00 = local_38;
        goto LAB_00109c54;
      }
      pcVar4 = (char *)local_38[(int)_optind];
      pcVar6 = strchr(pcVar4,0x40);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        *pcVar6 = '\0';
        pcVar6 = pcVar6 + 1;
      }
      lVar7 = ly_ctx_get_module(ctx,pcVar4,pcVar6,0);
      if (lVar7 == 0) {
        lVar7 = ly_ctx_get_submodule(ctx,0,0,pcVar4,pcVar6);
      }
      if (lVar7 != 0) {
        if ((int)states == 0) {
          uVar9 = 0;
          printf("%s features:\n",*(undefined8 *)(lVar7 + 8));
          __ptr = (long *)lys_features_list(lVar7,&stack0xffffffffffffffb8);
          pcVar4 = (char *)*__ptr;
          if (pcVar4 != (char *)0x0) {
            uVar9 = 0;
            plVar8 = __ptr;
            do {
              plVar8 = plVar8 + 1;
              sVar11 = strlen(pcVar4);
              uVar1 = sVar11 & 0xffffffff;
              if (sVar11 <= uVar9) {
                uVar1 = uVar9;
              }
              uVar9 = uVar1;
              pcVar4 = (char *)*plVar8;
            } while (pcVar4 != (char *)0x0);
          }
          puVar5 = (uint8_t *)*__ptr;
          if (puVar5 == (uint8_t *)0x0) {
            free(__ptr);
            free(pvStack_48);
LAB_00109c03:
            puts("\t(none)");
          }
          else {
            lVar7 = 1;
            states = puVar5;
            do {
              pcVar4 = "on";
              if (*(char *)((long)pvStack_48 + lVar7 + -1) == '\0') {
                pcVar4 = "off";
              }
              printf("\t%-*s (%s)\n",uVar9,puVar5,pcVar4);
              puVar5 = (uint8_t *)__ptr[lVar7];
              lVar7 = lVar7 + 1;
            } while (puVar5 != (uint8_t *)0x0);
            free(__ptr);
            free(pvStack_48);
            if (states == (uint8_t *)0x0) goto LAB_00109c03;
          }
          goto LAB_00109c15;
        }
        pcVar4 = strtok(local_58,",");
        goto joined_r0x00109ab5;
      }
      if (pcVar6 == (char *)0x0) {
        fprintf(_stderr,"No (sub)module \"%s\" found.\n",pcVar4);
      }
      else {
        fprintf(_stderr,"No (sub)module \"%s\" in revision %s found.\n",pcVar4,pcVar6);
      }
      goto LAB_00109c15;
    }
    if (iVar2 == 100) {
      puVar5 = (uint8_t *)0x2;
      if ((int)states == 0) goto LAB_001099f5;
      cmd_feature_cold_3();
      __ptr_00 = local_38;
      goto LAB_00109c54;
    }
  } while (iVar2 != 0x3f);
  cmd_feature_cold_2();
  __ptr_00 = local_38;
LAB_00109c54:
  iVar2 = 1;
LAB_00109c19:
  free((void *)*__ptr_00);
  free(__ptr_00);
  return iVar2;
joined_r0x00109ab5:
  if (pcVar4 == (char *)0x0) goto LAB_00109c15;
  if ((int)states == 2) {
LAB_00109aed:
    iVar2 = lys_features_disable(lVar7,pcVar4);
    if (iVar2 != 0) {
LAB_00109b13:
      fprintf(_stderr,"Feature \"%s\" not found.\n",pcVar4);
    }
  }
  else if ((int)states == 1) {
    iVar2 = lys_features_enable(lVar7,pcVar4);
    if (iVar2 != 0) goto LAB_00109b13;
    if ((int)states == 2) goto LAB_00109aed;
  }
  pcVar4 = strtok((char *)0x0,",");
  goto joined_r0x00109ab5;
LAB_00109c15:
  iVar2 = 1;
  __ptr_00 = local_38;
  goto LAB_00109c19;
}

Assistant:

int
cmd_feature(const char *arg)
{
    int c, i, argc, option_index, ret = 1, task = 0;
    unsigned int max_len;
    char **argv = NULL, *ptr, *model_name, *revision, *feat_names = NULL;
    const char **names;
    uint8_t *states;
    const struct lys_module *module;
    static struct option long_options[] = {
        {"help", no_argument, 0, 'h'},
        {"enable", required_argument, 0, 'e'},
        {"disable", required_argument, 0, 'd'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc + 2) * sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto cleanup;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "he:d:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'h':
            cmd_feature_help();
            ret = 0;
            goto cleanup;
        case 'e':
            if (task) {
                fprintf(stderr, "Only one of enable or disable can be specified.\n");
                goto cleanup;
            }
            task = 1;
            feat_names = optarg;
            break;
        case 'd':
            if (task) {
                fprintf(stderr, "Only one of enable, or disable can be specified.\n");
                goto cleanup;
            }
            task = 2;
            feat_names = optarg;
            break;
        case '?':
            fprintf(stderr, "Unknown option \"%d\".\n", (char)c);
            goto cleanup;
        }
    }

    /* module name */
    if (optind == argc) {
        fprintf(stderr, "Missing the module name.\n");
        goto cleanup;
    }

    revision = NULL;
    model_name = argv[optind];
    if (strchr(model_name, '@')) {
        revision = strchr(model_name, '@');
        revision[0] = '\0';
        ++revision;
    }

    module = ly_ctx_get_module(ctx, model_name, revision, 0);
    if (!module) {
        /* not a module, try to find it as a submodule */
        module = (const struct lys_module *)ly_ctx_get_submodule(ctx, NULL, NULL, model_name, revision);
    }

    if (module == NULL) {
        if (revision) {
            fprintf(stderr, "No (sub)module \"%s\" in revision %s found.\n", model_name, revision);
        } else {
            fprintf(stderr, "No (sub)module \"%s\" found.\n", model_name);
        }
        goto cleanup;
    }

    if (!task) {
        printf("%s features:\n", module->name);

        names = lys_features_list(module, &states);

        /* get the max len */
        max_len = 0;
        for (i = 0; names[i]; ++i) {
            if (strlen(names[i]) > max_len) {
                max_len = strlen(names[i]);
            }
        }
        for (i = 0; names[i]; ++i) {
            printf("\t%-*s (%s)\n", max_len, names[i], states[i] ? "on" : "off");
        }
        free(names);
        free(states);
        if (!i) {
            printf("\t(none)\n");
        }
    } else {
        feat_names = strtok(feat_names, ",");
        while (feat_names) {
            if (((task == 1) && lys_features_enable(module, feat_names))
                    || ((task == 2) && lys_features_disable(module, feat_names))) {
                fprintf(stderr, "Feature \"%s\" not found.\n", feat_names);
                ret = 1;
            }
            feat_names = strtok(NULL, ",");
        }
    }

cleanup:
    free(*argv);
    free(argv);

    return ret;
}